

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbrp_pack_rects(stbrp_context *con,stbrp_rect *rects,int num_rects)

{
  int local_20;
  int i;
  int num_rects_local;
  stbrp_rect *rects_local;
  stbrp_context *con_local;
  
  for (local_20 = 0; local_20 < num_rects; local_20 = local_20 + 1) {
    if (con->width < con->x + rects[local_20].w) {
      con->x = 0;
      con->y = con->bottom_y;
    }
    if (con->height < con->y + rects[local_20].h) break;
    rects[local_20].x = con->x;
    rects[local_20].y = con->y;
    rects[local_20].was_packed = 1;
    con->x = rects[local_20].w + con->x;
    if (con->bottom_y < con->y + rects[local_20].h) {
      con->bottom_y = con->y + rects[local_20].h;
    }
  }
  for (; local_20 < num_rects; local_20 = local_20 + 1) {
    rects[local_20].was_packed = 0;
  }
  return;
}

Assistant:

static void stbrp_pack_rects(stbrp_context *con, stbrp_rect *rects, int num_rects)
{
   int i;
   for (i=0; i < num_rects; ++i) {
      if (con->x + rects[i].w > con->width) {
         con->x = 0;
         con->y = con->bottom_y;
      }
      if (con->y + rects[i].h > con->height)
         break;
      rects[i].x = con->x;
      rects[i].y = con->y;
      rects[i].was_packed = 1;
      con->x += rects[i].w;
      if (con->y + rects[i].h > con->bottom_y)
         con->bottom_y = con->y + rects[i].h;
   }
   for (   ; i < num_rects; ++i)
      rects[i].was_packed = 0;
}